

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_io_SockAddrParser.cpp
# Opt level: O0

bool __thiscall axl::io::SockAddrParser::parse(SockAddrParser *this,in6_addr *addr)

{
  uint16_t uVar1;
  long lVar2;
  long in_RSI;
  SockAddrParser *in_RDI;
  size_t zeroRunLength;
  uint_t octet;
  size_t j;
  uint_t word;
  size_t i;
  uchar_t ip4 [4];
  bool isIp4;
  size_t zeroRunIdx;
  uint16_t *ip;
  bool result;
  undefined8 in_stack_ffffffffffffff50;
  char in_stack_ffffffffffffff77;
  SockAddrParser *in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  undefined8 in_stack_ffffffffffffff88;
  ulong uVar3;
  uint_t *in_stack_ffffffffffffff90;
  SockAddrParser *in_stack_ffffffffffffff98;
  uint local_44;
  ulong local_40;
  byte local_35 [4];
  byte local_31;
  ulong local_30;
  long local_28;
  bool local_19;
  bool local_1;
  
  local_30 = 0xffffffffffffffff;
  local_31 = 0;
  local_28 = in_RSI;
  tryChar(in_RDI,(char)((ulong)in_stack_ffffffffffffff50 >> 0x38));
  local_40 = 0;
  do {
    if (7 < local_40) break;
    local_19 = tryChar(in_RDI,(char)((ulong)in_stack_ffffffffffffff50 >> 0x38));
    if (local_19) {
      local_30 = local_40;
    }
    local_19 = parseInt(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
                        (int)((ulong)in_stack_ffffffffffffff88 >> 0x20));
    if (!local_19) {
      return false;
    }
    local_19 = tryChar(in_RDI,(char)((ulong)in_stack_ffffffffffffff50 >> 0x38));
    if ((!local_19) &&
       (local_19 = tryChar(in_RDI,(char)((ulong)in_stack_ffffffffffffff50 >> 0x38)), local_19)) {
      if (6 < local_40) {
        err::ErrorRef::ErrorRef
                  ((ErrorRef *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                   (uint_t)((ulong)in_stack_ffffffffffffff78 >> 0x20));
        err::setError((ErrorRef *)0x17a08c);
        err::ErrorRef::~ErrorRef((ErrorRef *)0x17a098);
        return false;
      }
      local_35[0] = ((byte)local_44 & 0xf) + (char)((local_44 & 0xf0) >> 4) * '\n' +
                    ((byte)(local_44 >> 8) & 0xf) * 'd';
      local_31 = 1;
      break;
    }
    uVar1 = sl::swapByteOrder16(0);
    *(uint16_t *)(local_28 + local_40 * 2) = uVar1;
    local_40 = local_40 + 1;
  } while ((local_19 & 1U) != 0);
  if ((local_31 & 1) == 0) {
LAB_0017a24b:
    if (local_30 == 0xffffffffffffffff) {
      if (local_40 != 8) {
        err::ErrorRef::ErrorRef
                  ((ErrorRef *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                   (uint_t)((ulong)in_stack_ffffffffffffff78 >> 0x20));
        err::setError((ErrorRef *)0x17a309);
        err::ErrorRef::~ErrorRef((ErrorRef *)0x17a315);
        return false;
      }
    }
    else {
      lVar2 = 8 - local_40;
      if (local_30 < local_40) {
        memmove((void *)(local_28 + (local_30 + lVar2) * 2),(void *)(local_28 + local_30 * 2),
                (local_40 - local_30) * 2);
        memset((void *)(local_28 + local_30 * 2),0,lVar2 << 1);
      }
    }
    local_1 = true;
  }
  else {
    uVar3 = 1;
    while (local_19 = parseInt(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
                               (int)(uVar3 >> 0x20)), local_19) {
      local_35[uVar3] = (byte)in_stack_ffffffffffffff84;
      if (2 < uVar3) {
        *(ushort *)(local_28 + local_40 * 2) = (ushort)local_35[0] + (ushort)local_35[1] * 0x100;
        *(ushort *)(local_28 + 2 + local_40 * 2) = (ushort)local_35[2] + (ushort)local_35[3] * 0x100
        ;
        local_40 = local_40 + 2;
        goto LAB_0017a24b;
      }
      local_19 = expectChar(in_stack_ffffffffffffff78,in_stack_ffffffffffffff77);
      if (!local_19) {
        return false;
      }
      uVar3 = uVar3 + 1;
    }
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool
SockAddrParser::parse(in6_addr* addr) {
	bool result;

	uint16_t* ip = (uint16_t*)addr;

	size_t zeroRunIdx = -1;
	bool isIp4 = false;
	uchar_t ip4[4];

	tryChar(':');

	size_t i = 0;
	while (i < 8) {
		result = tryChar(':');
		if (result)
			zeroRunIdx = i;

		uint_t word;
		result = parseInt(&word, 16);
		if (!result)
			return false;

		result = tryChar(':');
		if (!result) {
			result = tryChar('.');
			if (result) {
				if (i > 6) {
					err::setError(err::SystemErrorCode_InvalidAddress);
					return false;
				}

				ip4[0] = (uchar_t)
					((word & 0x0f) +
					((word & 0xf0) >> 4) * 10 +
					((word & 0xf00) >> 8) * 100);

				isIp4 = true;
				break;
			}
		}

		ip[i] = sl::swapByteOrder16((uint16_t)word);
		i++;

		if (!result)
			break;
	}

	if (isIp4) {
		for (size_t j = 1;; j++) {
			uint_t octet;
			result = parseInt(&octet, 10);
			if (!result)
				return false;

			ip4[j] = (uchar_t)octet;

			if (j >= 3)
				break;

			result = expectChar('.');
			if (!result)
				return false;
		}

		ASSERT(i <= 6);
		ip[i] = ip4[0] + (ip4[1] << 8);
		ip[i + 1] = ip4[2] + (ip4[3] << 8);
		i += 2;
	}

	if (zeroRunIdx != -1) {
		ASSERT(i <= 8 && zeroRunIdx <= i);

		size_t zeroRunLength = 8 - i;

		if (zeroRunIdx < i) {
			memmove(&ip[zeroRunIdx + zeroRunLength], &ip[zeroRunIdx], (i - zeroRunIdx) * sizeof(uint16_t));
			memset(&ip[zeroRunIdx], 0, zeroRunLength * sizeof(uint16_t));
		}
	} else if (i != 8) {
		err::setError(err::SystemErrorCode_InvalidAddress);
		return false;
	}

	return true;
}